

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapBlockMap32 *this,
          SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,char *pageAddress,
          HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,Recycler *recycler)

{
  code *pcVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  BVStatic<2048UL> *heapBlockMarkBits;
  char *blockStartAddress;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if (heapBlock == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_0062f6dc;
    *puVar6 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.heapBlockType !=
      blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar3) goto LAB_0062f6dc;
    *puVar6 = 0;
  }
  heapBlockMarkBits =
       GetMarkBitVectorForPages<2048ul>
                 (this,(heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
                       super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.
                       address);
  blockStartAddress = (char *)((ulong)pageAddress & 0xffffffffffff8000);
  if (blockStartAddress != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar3) {
LAB_0062f6dc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetUnusablePageCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  uVar9 = uVar4 - uVar5;
  uVar7 = 0;
  uVar2 = 0;
  if (0 < (int)uVar9) {
    uVar7 = (ulong)uVar9;
  }
  do {
    uVar8 = uVar2;
    if (uVar8 == uVar7) {
      this->anyHeapBlockRescannedDuringOOM = true;
      break;
    }
    uVar4 = HeapInfo::GetObjectSizeForBucketIndex<MediumAllocationBlockAttributes>(bucketIndex);
    bVar3 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
            ::RescanObjectsOnPage
                      (heapBlock,blockStartAddress + (uint)((int)uVar8 << 0xc),blockStartAddress,
                       heapBlockMarkBits,uVar4,bucketIndex,(bool *)0x0,recycler);
    if (!bVar3) {
      HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
    }
    bVar3 = Recycler::NeedOOMRescan(recycler);
    uVar2 = uVar8 + 1;
  } while (!bVar3);
  return (long)(int)uVar9 <= (long)uVar8;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}